

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::anon_unknown_26::AssertionPrinter::printMessage(AssertionPrinter *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer pMVar3;
  __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
  *in_RDI;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *in_stack_ffffffffffffffd8;
  
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
            (in_stack_ffffffffffffffd8);
  bVar1 = __gnu_cxx::operator!=
                    (in_RDI,(__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                             *)in_stack_ffffffffffffffd8);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)in_RDI->_M_current," \'");
    pMVar3 = __gnu_cxx::
             __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
             ::operator->(in_RDI + 3);
    poVar2 = std::operator<<(poVar2,(string *)&pMVar3->message);
    std::operator<<(poVar2,'\'');
    __gnu_cxx::
    __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
    ::operator++(in_RDI + 3);
  }
  return;
}

Assistant:

void printMessage() {
        if (itMessage != messages.end()) {
            stream << " '" << itMessage->message << '\'';
            ++itMessage;
        }
    }